

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  BaseNode_conflict *node;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  Scene *pSVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar41;
  undefined1 auVar34 [16];
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  float fVar43;
  float fVar53;
  float fVar54;
  undefined1 auVar44 [16];
  float fVar55;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar56;
  float fVar66;
  float fVar67;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar83;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  float fVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar72 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  float fVar85;
  float fVar86;
  float fVar94;
  float fVar97;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar87;
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar98;
  undefined1 auVar88 [16];
  float fVar100;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar127 [16];
  float fVar124;
  float fVar135;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar144;
  float fVar145;
  undefined1 auVar143 [16];
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar148 [64];
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [64];
  float fVar157;
  undefined1 auVar158 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [64];
  float fVar163;
  float fVar164;
  undefined1 auVar165 [16];
  float fVar172;
  undefined1 auVar166 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar173;
  undefined1 auVar167 [64];
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_151d;
  int local_151c;
  undefined8 local_1518;
  float fStack_1510;
  float fStack_150c;
  undefined1 local_1508 [16];
  undefined8 local_14f8;
  float fStack_14f0;
  float fStack_14ec;
  RayQueryContext *local_14e0;
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  ulong *local_1480;
  long local_1478;
  long local_1470;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  undefined4 local_1454;
  uint local_1450;
  uint local_144c;
  uint local_1448;
  RTCFilterFunctionNArguments local_1438;
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 *local_1358;
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar43 = ray->tfar;
    if (0.0 <= fVar43) {
      aVar5 = (ray->dir).field_0;
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81 = vandps_avx((undefined1  [16])aVar5,auVar81);
      auVar101._8_4_ = 0x219392ef;
      auVar101._0_8_ = 0x219392ef219392ef;
      auVar101._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar101,1);
      auVar81 = vblendvps_avx((undefined1  [16])aVar5,auVar101,auVar81);
      puVar29 = local_11d8 + 1;
      auVar101 = vrcpps_avx(auVar81);
      fVar85 = auVar101._0_4_;
      auVar70._0_4_ = fVar85 * auVar81._0_4_;
      fVar93 = auVar101._4_4_;
      auVar70._4_4_ = fVar93 * auVar81._4_4_;
      fVar96 = auVar101._8_4_;
      auVar70._8_4_ = fVar96 * auVar81._8_4_;
      fVar66 = auVar101._12_4_;
      auVar70._12_4_ = fVar66 * auVar81._12_4_;
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar81 = vsubps_avx(auVar102,auVar70);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_1258._4_4_ = uVar4;
      local_1258._0_4_ = uVar4;
      local_1258._8_4_ = uVar4;
      local_1258._12_4_ = uVar4;
      local_1258._16_4_ = uVar4;
      local_1258._20_4_ = uVar4;
      local_1258._24_4_ = uVar4;
      local_1258._28_4_ = uVar4;
      auVar148 = ZEXT3264(local_1258);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1278._4_4_ = uVar4;
      local_1278._0_4_ = uVar4;
      local_1278._8_4_ = uVar4;
      local_1278._12_4_ = uVar4;
      local_1278._16_4_ = uVar4;
      local_1278._20_4_ = uVar4;
      local_1278._24_4_ = uVar4;
      local_1278._28_4_ = uVar4;
      auVar153 = ZEXT3264(local_1278);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1298._4_4_ = uVar4;
      local_1298._0_4_ = uVar4;
      local_1298._8_4_ = uVar4;
      local_1298._12_4_ = uVar4;
      local_1298._16_4_ = uVar4;
      local_1298._20_4_ = uVar4;
      local_1298._24_4_ = uVar4;
      local_1298._28_4_ = uVar4;
      auVar159 = ZEXT3264(local_1298);
      auVar71._0_4_ = fVar85 + fVar85 * auVar81._0_4_;
      auVar71._4_4_ = fVar93 + fVar93 * auVar81._4_4_;
      auVar71._8_4_ = fVar96 + fVar96 * auVar81._8_4_;
      auVar71._12_4_ = fVar66 + fVar66 * auVar81._12_4_;
      auVar81 = vshufps_avx(auVar71,auVar71,0);
      local_12b8._16_16_ = auVar81;
      local_12b8._0_16_ = auVar81;
      auVar167 = ZEXT3264(local_12b8);
      auVar81 = vmovshdup_avx(auVar71);
      auVar101 = vshufps_avx(auVar71,auVar71,0x55);
      local_12d8._16_16_ = auVar101;
      local_12d8._0_16_ = auVar101;
      auVar175 = ZEXT3264(local_12d8);
      auVar101 = vshufpd_avx(auVar71,auVar71,1);
      auVar70 = vshufps_avx(auVar71,auVar71,0xaa);
      local_11f8._16_16_ = auVar70;
      local_11f8._0_16_ = auVar70;
      uVar30 = (ulong)(auVar71._0_4_ < 0.0) << 3;
      uVar20 = (ulong)(auVar81._0_4_ < 0.0);
      lVar1 = uVar20 * 8;
      uVar21 = (ulong)(auVar101._0_4_ < 0.0);
      lVar2 = uVar21 * 8;
      auVar81 = vshufps_avx(auVar34,auVar34,0);
      local_1218._16_16_ = auVar81;
      local_1218._0_16_ = auVar81;
      auVar81 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      local_1238._16_16_ = auVar81;
      local_1238._0_16_ = auVar81;
      uVar31 = uVar30 ^ 8;
      uVar28 = lVar1 + 0x10U ^ 8;
      uVar33 = lVar2 + 0x20U ^ 8;
      local_1408 = mm_lookupmask_ps._240_16_;
      local_14e0 = context;
LAB_00e7328e:
      if (puVar29 != local_11d8) {
        uVar32 = puVar29[-1];
        puVar29 = puVar29 + -1;
        while ((uVar32 & 8) == 0) {
          uVar22 = uVar32 & 0xfffffffffffffff0;
          puVar25 = (ulong *)(uVar22 + 0x40);
          if (uVar22 == 0) {
            puVar25 = (ulong *)0x0;
          }
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *puVar25;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = puVar25[1];
          auVar81 = vpminub_avx(auVar34,auVar57);
          auVar81 = vpcmpeqb_avx(auVar34,auVar81);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)((long)puVar25 + 4);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)((long)puVar25 + 0xc);
          auVar34 = vpminub_avx(auVar44,auVar72);
          fVar43 = *(float *)(puVar25 + 6);
          auVar34 = vpcmpeqb_avx(auVar44,auVar34);
          fVar85 = *(float *)((long)puVar25 + 0x3c);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)((long)puVar25 + uVar30);
          auVar101 = vpmovzxbd_avx(auVar58);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar25 + uVar30 + 4);
          auVar70 = vpmovzxbd_avx(auVar103);
          auVar64._16_16_ = auVar70;
          auVar64._0_16_ = auVar101;
          auVar64 = vcvtdq2ps_avx(auVar64);
          auVar65._0_4_ = fVar43 + fVar85 * auVar64._0_4_;
          auVar65._4_4_ = fVar43 + fVar85 * auVar64._4_4_;
          auVar65._8_4_ = fVar43 + fVar85 * auVar64._8_4_;
          auVar65._12_4_ = fVar43 + fVar85 * auVar64._12_4_;
          auVar65._16_4_ = fVar43 + fVar85 * auVar64._16_4_;
          auVar65._20_4_ = fVar43 + fVar85 * auVar64._20_4_;
          auVar65._24_4_ = fVar43 + fVar85 * auVar64._24_4_;
          auVar65._28_4_ = fVar43 + auVar64._28_4_;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)((long)puVar25 + uVar31);
          auVar101 = vpmovzxbd_avx(auVar104);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)((long)puVar25 + uVar31 + 4);
          auVar70 = vpmovzxbd_avx(auVar110);
          auVar108._16_16_ = auVar70;
          auVar108._0_16_ = auVar101;
          auVar64 = vcvtdq2ps_avx(auVar108);
          fVar93 = *(float *)((long)puVar25 + 0x34);
          auVar82._0_4_ = fVar43 + fVar85 * auVar64._0_4_;
          auVar82._4_4_ = fVar43 + fVar85 * auVar64._4_4_;
          auVar82._8_4_ = fVar43 + fVar85 * auVar64._8_4_;
          auVar82._12_4_ = fVar43 + fVar85 * auVar64._12_4_;
          auVar82._16_4_ = fVar43 + fVar85 * auVar64._16_4_;
          auVar82._20_4_ = fVar43 + fVar85 * auVar64._20_4_;
          auVar82._24_4_ = fVar43 + fVar85 * auVar64._24_4_;
          auVar82._28_4_ = fVar43 + fVar85;
          fVar43 = *(float *)(puVar25 + 8);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = puVar25[uVar20 + 2];
          auVar101 = vpmovzxbd_avx(auVar88);
          auVar115._8_8_ = 0;
          auVar115._0_8_ = *(ulong *)((long)puVar25 + lVar1 + 0x14);
          auVar70 = vpmovzxbd_avx(auVar115);
          auVar91._16_16_ = auVar70;
          auVar91._0_16_ = auVar101;
          auVar64 = vcvtdq2ps_avx(auVar91);
          auVar92._0_4_ = fVar93 + fVar43 * auVar64._0_4_;
          auVar92._4_4_ = fVar93 + fVar43 * auVar64._4_4_;
          auVar92._8_4_ = fVar93 + fVar43 * auVar64._8_4_;
          auVar92._12_4_ = fVar93 + fVar43 * auVar64._12_4_;
          auVar92._16_4_ = fVar93 + fVar43 * auVar64._16_4_;
          auVar92._20_4_ = fVar93 + fVar43 * auVar64._20_4_;
          auVar92._24_4_ = fVar93 + fVar43 * auVar64._24_4_;
          auVar92._28_4_ = fVar93 + auVar64._28_4_;
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)((long)puVar25 + uVar28);
          auVar101 = vpmovzxbd_avx(auVar116);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)((long)puVar25 + uVar28 + 4);
          auVar70 = vpmovzxbd_avx(auVar125);
          auVar123._16_16_ = auVar70;
          auVar123._0_16_ = auVar101;
          auVar64 = vcvtdq2ps_avx(auVar123);
          fVar85 = *(float *)(puVar25 + 7);
          auVar109._0_4_ = fVar93 + fVar43 * auVar64._0_4_;
          auVar109._4_4_ = fVar93 + fVar43 * auVar64._4_4_;
          auVar109._8_4_ = fVar93 + fVar43 * auVar64._8_4_;
          auVar109._12_4_ = fVar93 + fVar43 * auVar64._12_4_;
          auVar109._16_4_ = fVar93 + fVar43 * auVar64._16_4_;
          auVar109._20_4_ = fVar93 + fVar43 * auVar64._20_4_;
          auVar109._24_4_ = fVar93 + fVar43 * auVar64._24_4_;
          auVar109._28_4_ = fVar93 + fVar43;
          fVar43 = *(float *)((long)puVar25 + 0x44);
          auVar126._8_8_ = 0;
          auVar126._0_8_ = puVar25[uVar21 + 4];
          auVar101 = vpmovzxbd_avx(auVar126);
          auVar136._8_8_ = 0;
          auVar136._0_8_ = *(ulong *)((long)puVar25 + lVar2 + 0x24);
          auVar70 = vpmovzxbd_avx(auVar136);
          auVar131._16_16_ = auVar70;
          auVar131._0_16_ = auVar101;
          auVar137._8_8_ = 0;
          auVar137._0_8_ = *(ulong *)((long)puVar25 + uVar33);
          auVar101 = vpmovzxbd_avx(auVar137);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)((long)puVar25 + uVar33 + 4);
          auVar70 = vpmovzxbd_avx(auVar143);
          auVar141._16_16_ = auVar70;
          auVar141._0_16_ = auVar101;
          auVar64 = vcvtdq2ps_avx(auVar131);
          auVar14 = vcvtdq2ps_avx(auVar141);
          auVar132._0_4_ = auVar64._0_4_ * fVar43 + fVar85;
          auVar132._4_4_ = auVar64._4_4_ * fVar43 + fVar85;
          auVar132._8_4_ = auVar64._8_4_ * fVar43 + fVar85;
          auVar132._12_4_ = auVar64._12_4_ * fVar43 + fVar85;
          auVar132._16_4_ = auVar64._16_4_ * fVar43 + fVar85;
          auVar132._20_4_ = auVar64._20_4_ * fVar43 + fVar85;
          auVar132._24_4_ = auVar64._24_4_ * fVar43 + fVar85;
          auVar132._28_4_ = auVar64._28_4_ + fVar85;
          auVar114._0_4_ = fVar85 + auVar14._0_4_ * fVar43;
          auVar114._4_4_ = fVar85 + auVar14._4_4_ * fVar43;
          auVar114._8_4_ = fVar85 + auVar14._8_4_ * fVar43;
          auVar114._12_4_ = fVar85 + auVar14._12_4_ * fVar43;
          auVar114._16_4_ = fVar85 + auVar14._16_4_ * fVar43;
          auVar114._20_4_ = fVar85 + auVar14._20_4_ * fVar43;
          auVar114._24_4_ = fVar85 + auVar14._24_4_ * fVar43;
          auVar114._28_4_ = fVar85 + fVar43;
          auVar64 = vsubps_avx(auVar65,auVar148._0_32_);
          auVar14._4_4_ = auVar167._4_4_ * auVar64._4_4_;
          auVar14._0_4_ = auVar167._0_4_ * auVar64._0_4_;
          auVar14._8_4_ = auVar167._8_4_ * auVar64._8_4_;
          auVar14._12_4_ = auVar167._12_4_ * auVar64._12_4_;
          auVar14._16_4_ = auVar167._16_4_ * auVar64._16_4_;
          auVar14._20_4_ = auVar167._20_4_ * auVar64._20_4_;
          auVar14._24_4_ = auVar167._24_4_ * auVar64._24_4_;
          auVar14._28_4_ = auVar64._28_4_;
          auVar64 = vsubps_avx(auVar92,auVar153._0_32_);
          auVar15._4_4_ = auVar175._4_4_ * auVar64._4_4_;
          auVar15._0_4_ = auVar175._0_4_ * auVar64._0_4_;
          auVar15._8_4_ = auVar175._8_4_ * auVar64._8_4_;
          auVar15._12_4_ = auVar175._12_4_ * auVar64._12_4_;
          auVar15._16_4_ = auVar175._16_4_ * auVar64._16_4_;
          auVar15._20_4_ = auVar175._20_4_ * auVar64._20_4_;
          auVar15._24_4_ = auVar175._24_4_ * auVar64._24_4_;
          auVar15._28_4_ = auVar64._28_4_;
          auVar64 = vmaxps_avx(auVar14,auVar15);
          auVar14 = vsubps_avx(auVar132,auVar159._0_32_);
          auVar16._4_4_ = local_11f8._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = local_11f8._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = local_11f8._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = local_11f8._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = local_11f8._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = local_11f8._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = local_11f8._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar14 = vmaxps_avx(auVar16,local_1218);
          auVar64 = vmaxps_avx(auVar64,auVar14);
          auVar14 = vsubps_avx(auVar82,auVar148._0_32_);
          auVar17._4_4_ = auVar167._4_4_ * auVar14._4_4_;
          auVar17._0_4_ = auVar167._0_4_ * auVar14._0_4_;
          auVar17._8_4_ = auVar167._8_4_ * auVar14._8_4_;
          auVar17._12_4_ = auVar167._12_4_ * auVar14._12_4_;
          auVar17._16_4_ = auVar167._16_4_ * auVar14._16_4_;
          auVar17._20_4_ = auVar167._20_4_ * auVar14._20_4_;
          auVar17._24_4_ = auVar167._24_4_ * auVar14._24_4_;
          auVar17._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(auVar109,auVar153._0_32_);
          auVar18._4_4_ = auVar175._4_4_ * auVar14._4_4_;
          auVar18._0_4_ = auVar175._0_4_ * auVar14._0_4_;
          auVar18._8_4_ = auVar175._8_4_ * auVar14._8_4_;
          auVar18._12_4_ = auVar175._12_4_ * auVar14._12_4_;
          auVar18._16_4_ = auVar175._16_4_ * auVar14._16_4_;
          auVar18._20_4_ = auVar175._20_4_ * auVar14._20_4_;
          auVar18._24_4_ = auVar175._24_4_ * auVar14._24_4_;
          auVar18._28_4_ = auVar14._28_4_;
          auVar14 = vminps_avx(auVar17,auVar18);
          auVar15 = vsubps_avx(auVar114,auVar159._0_32_);
          auVar19._4_4_ = local_11f8._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = local_11f8._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = local_11f8._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = local_11f8._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = local_11f8._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = local_11f8._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = local_11f8._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar19,local_1238);
          auVar14 = vminps_avx(auVar14,auVar15);
          auVar64 = vcmpps_avx(auVar64,auVar14,2);
          auVar101 = vpcmpeqd_avx(auVar14._0_16_,auVar14._0_16_);
          auVar81 = vpmovsxbd_avx(auVar81 ^ auVar101);
          auVar34 = vpmovsxbd_avx(auVar34 ^ auVar101);
          auVar40._16_16_ = auVar34;
          auVar40._0_16_ = auVar81;
          auVar14 = vcvtdq2ps_avx(auVar40);
          auVar52._8_4_ = 0xbf800000;
          auVar52._0_8_ = 0xbf800000bf800000;
          auVar52._12_4_ = 0xbf800000;
          auVar52._16_4_ = 0xbf800000;
          auVar52._20_4_ = 0xbf800000;
          auVar52._24_4_ = 0xbf800000;
          auVar52._28_4_ = 0xbf800000;
          auVar14 = vcmpps_avx(auVar52,auVar14,1);
          auVar64 = vandps_avx(auVar64,auVar14);
          uVar24 = vmovmskps_avx(auVar64);
          if (uVar24 == 0) goto LAB_00e7328e;
          lVar23 = 0;
          if ((byte)uVar24 != 0) {
            for (; ((byte)uVar24 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar32 = *(ulong *)(uVar22 + lVar23 * 8);
          uVar24 = (uVar24 & 0xff) - 1 & uVar24 & 0xff;
          uVar26 = (ulong)uVar24;
          if (uVar24 != 0) {
            do {
              *puVar29 = uVar32;
              puVar29 = puVar29 + 1;
              lVar23 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              uVar32 = *(ulong *)(uVar22 + lVar23 * 8);
              uVar26 = uVar26 - 1 & uVar26;
            } while (uVar26 != 0);
          }
        }
        local_1470 = (ulong)((uint)uVar32 & 0xf) - 8;
        uVar32 = uVar32 & 0xfffffffffffffff0;
        for (local_1478 = 0; local_1478 != local_1470; local_1478 = local_1478 + 1) {
          lVar23 = local_1478 * 0x50;
          pSVar27 = context->scene;
          ppfVar6 = (pSVar27->vertices).items;
          pfVar7 = ppfVar6[*(uint *)(uVar32 + 0x30 + lVar23)];
          pfVar8 = ppfVar6[*(uint *)(uVar32 + 0x34 + lVar23)];
          pfVar9 = ppfVar6[*(uint *)(uVar32 + 0x38 + lVar23)];
          pfVar10 = ppfVar6[*(uint *)(uVar32 + 0x3c + lVar23)];
          auVar101 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + lVar23)),
                                   *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar32 + 8 + lVar23)));
          auVar81 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + lVar23)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar32 + 8 + lVar23)));
          auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 4 + lVar23)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar32 + 0xc + lVar23))
                                 );
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 4 + lVar23)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar32 + 0xc + lVar23))
                                 );
          auVar102 = vunpcklps_avx(auVar81,auVar34);
          auVar44 = vunpcklps_avx(auVar101,auVar70);
          auVar81 = vunpckhps_avx(auVar101,auVar70);
          auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x10 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar32 + 0x18 + lVar23)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x10 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar32 + 0x18 + lVar23)));
          auVar71 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 0x14 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar32 + 0x1c + lVar23)));
          auVar101 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar32 + 0x14 + lVar23)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar32 + 0x1c + lVar23)));
          auVar57 = vunpcklps_avx(auVar34,auVar101);
          auVar58 = vunpcklps_avx(auVar70,auVar71);
          auVar34 = vunpckhps_avx(auVar70,auVar71);
          auVar71 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x20 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar32 + 0x28 + lVar23)));
          auVar101 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar32 + 0x20 + lVar23)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar32 + 0x28 + lVar23)));
          auVar72 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 0x24 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar32 + 0x2c + lVar23)));
          auVar70 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar32 + 0x24 + lVar23))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar32 + 0x2c + lVar23)));
          auVar88 = vunpcklps_avx(auVar101,auVar70);
          auVar70 = vunpcklps_avx(auVar71,auVar72);
          auVar71 = vunpckhps_avx(auVar71,auVar72);
          puVar3 = (undefined8 *)(uVar32 + 0x30 + lVar23);
          local_1398 = *puVar3;
          uStack_1390 = puVar3[1];
          puVar3 = (undefined8 *)(uVar32 + 0x40 + lVar23);
          local_13a8 = *puVar3;
          uStack_13a0 = puVar3[1];
          uVar4 = *(undefined4 *)&(ray->org).field_0;
          auVar138._4_4_ = uVar4;
          auVar138._0_4_ = uVar4;
          auVar138._8_4_ = uVar4;
          auVar138._12_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar158._4_4_ = uVar4;
          auVar158._0_4_ = uVar4;
          auVar158._8_4_ = uVar4;
          auVar158._12_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar165._4_4_ = uVar4;
          auVar165._0_4_ = uVar4;
          auVar165._8_4_ = uVar4;
          auVar165._12_4_ = uVar4;
          local_1498 = vsubps_avx(auVar44,auVar138);
          local_14a8 = vsubps_avx(auVar81,auVar158);
          local_14b8 = vsubps_avx(auVar102,auVar165);
          auVar81 = vsubps_avx(auVar58,auVar138);
          auVar34 = vsubps_avx(auVar34,auVar158);
          auVar101 = vsubps_avx(auVar57,auVar165);
          auVar70 = vsubps_avx(auVar70,auVar138);
          auVar71 = vsubps_avx(auVar71,auVar158);
          auVar102 = vsubps_avx(auVar88,auVar165);
          local_14c8 = vsubps_avx(auVar70,local_1498);
          local_14d8 = vsubps_avx(auVar71,local_14a8);
          local_13b8 = vsubps_avx(auVar102,local_14b8);
          fVar85 = local_14a8._0_4_;
          fVar43 = auVar71._0_4_ + fVar85;
          fVar96 = local_14a8._4_4_;
          fVar53 = auVar71._4_4_ + fVar96;
          fVar68 = local_14a8._8_4_;
          fVar54 = auVar71._8_4_ + fVar68;
          fVar12 = local_14a8._12_4_;
          fVar55 = auVar71._12_4_ + fVar12;
          fVar142 = local_14b8._0_4_;
          fVar86 = fVar142 + auVar102._0_4_;
          fVar144 = local_14b8._4_4_;
          fVar94 = fVar144 + auVar102._4_4_;
          fVar145 = local_14b8._8_4_;
          fVar97 = fVar145 + auVar102._8_4_;
          fVar146 = local_14b8._12_4_;
          fVar99 = fVar146 + auVar102._12_4_;
          fVar56 = local_13b8._0_4_;
          auVar127._0_4_ = fVar56 * fVar43;
          fVar67 = local_13b8._4_4_;
          auVar127._4_4_ = fVar67 * fVar53;
          fVar41 = local_13b8._8_4_;
          auVar127._8_4_ = fVar41 * fVar54;
          fVar42 = local_13b8._12_4_;
          auVar127._12_4_ = fVar42 * fVar55;
          fVar174 = local_14d8._0_4_;
          auVar139._0_4_ = fVar174 * fVar86;
          fVar176 = local_14d8._4_4_;
          auVar139._4_4_ = fVar176 * fVar94;
          fVar177 = local_14d8._8_4_;
          auVar139._8_4_ = fVar177 * fVar97;
          fVar178 = local_14d8._12_4_;
          auVar139._12_4_ = fVar178 * fVar99;
          auVar44 = vsubps_avx(auVar139,auVar127);
          fVar93 = local_1498._0_4_;
          fVar124 = auVar70._0_4_ + fVar93;
          fVar66 = local_1498._4_4_;
          fVar133 = auVar70._4_4_ + fVar66;
          fVar69 = local_1498._8_4_;
          fVar134 = auVar70._8_4_ + fVar69;
          fVar13 = local_1498._12_4_;
          fVar135 = auVar70._12_4_ + fVar13;
          fVar163 = local_14c8._0_4_;
          auVar89._0_4_ = fVar163 * fVar86;
          fVar168 = local_14c8._4_4_;
          auVar89._4_4_ = fVar168 * fVar94;
          fVar170 = local_14c8._8_4_;
          auVar89._8_4_ = fVar170 * fVar97;
          fVar172 = local_14c8._12_4_;
          auVar89._12_4_ = fVar172 * fVar99;
          auVar140._0_4_ = fVar124 * fVar56;
          auVar140._4_4_ = fVar133 * fVar67;
          auVar140._8_4_ = fVar134 * fVar41;
          auVar140._12_4_ = fVar135 * fVar42;
          auVar57 = vsubps_avx(auVar140,auVar89);
          auVar128._0_4_ = fVar174 * fVar124;
          auVar128._4_4_ = fVar176 * fVar133;
          auVar128._8_4_ = fVar177 * fVar134;
          auVar128._12_4_ = fVar178 * fVar135;
          auVar35._0_4_ = fVar163 * fVar43;
          auVar35._4_4_ = fVar168 * fVar53;
          auVar35._8_4_ = fVar170 * fVar54;
          auVar35._12_4_ = fVar172 * fVar55;
          auVar58 = vsubps_avx(auVar35,auVar128);
          fVar43 = (ray->dir).field_0.m128[2];
          local_1508._4_4_ = fVar43;
          local_1508._0_4_ = fVar43;
          local_1508._8_4_ = fVar43;
          local_1508._12_4_ = fVar43;
          local_1518._4_4_ = (ray->dir).field_0.m128[1];
          fStack_14f0 = (ray->dir).field_0.m128[0];
          local_14f8 = (RTCIntersectArguments *)CONCAT44(fStack_14f0,fStack_14f0);
          fStack_14ec = fStack_14f0;
          local_13d8._0_4_ =
               auVar44._0_4_ * fStack_14f0 +
               local_1518._4_4_ * auVar57._0_4_ + fVar43 * auVar58._0_4_;
          local_13d8._4_4_ =
               auVar44._4_4_ * fStack_14f0 +
               local_1518._4_4_ * auVar57._4_4_ + fVar43 * auVar58._4_4_;
          local_13d8._8_4_ =
               auVar44._8_4_ * fStack_14f0 +
               local_1518._4_4_ * auVar57._8_4_ + fVar43 * auVar58._8_4_;
          local_13d8._12_4_ =
               auVar44._12_4_ * fStack_14f0 +
               local_1518._4_4_ * auVar57._12_4_ + fVar43 * auVar58._12_4_;
          local_13c8 = vsubps_avx(local_14a8,auVar34);
          auVar44 = vsubps_avx(local_14b8,auVar101);
          fVar53 = fVar85 + auVar34._0_4_;
          fVar54 = fVar96 + auVar34._4_4_;
          fVar55 = fVar68 + auVar34._8_4_;
          fVar86 = fVar12 + auVar34._12_4_;
          fVar94 = fVar142 + auVar101._0_4_;
          fVar97 = fVar144 + auVar101._4_4_;
          fVar99 = fVar145 + auVar101._8_4_;
          fVar124 = fVar146 + auVar101._12_4_;
          fVar147 = auVar44._0_4_;
          auVar166._0_4_ = fVar147 * fVar53;
          fVar149 = auVar44._4_4_;
          auVar166._4_4_ = fVar149 * fVar54;
          fVar150 = auVar44._8_4_;
          auVar166._8_4_ = fVar150 * fVar55;
          fVar151 = auVar44._12_4_;
          auVar166._12_4_ = fVar151 * fVar86;
          fVar157 = local_13c8._0_4_;
          auVar73._0_4_ = fVar157 * fVar94;
          fVar160 = local_13c8._4_4_;
          auVar73._4_4_ = fVar160 * fVar97;
          fVar161 = local_13c8._8_4_;
          auVar73._8_4_ = fVar161 * fVar99;
          fVar162 = local_13c8._12_4_;
          auVar73._12_4_ = fVar162 * fVar124;
          auVar44 = vsubps_avx(auVar73,auVar166);
          auVar57 = vsubps_avx(local_1498,auVar81);
          fVar164 = auVar57._0_4_;
          auVar90._0_4_ = fVar164 * fVar94;
          fVar169 = auVar57._4_4_;
          auVar90._4_4_ = fVar169 * fVar97;
          fVar171 = auVar57._8_4_;
          auVar90._8_4_ = fVar171 * fVar99;
          fVar173 = auVar57._12_4_;
          auVar90._12_4_ = fVar173 * fVar124;
          fVar94 = fVar93 + auVar81._0_4_;
          fVar97 = fVar66 + auVar81._4_4_;
          fVar99 = fVar69 + auVar81._8_4_;
          fVar124 = fVar13 + auVar81._12_4_;
          auVar129._0_4_ = fVar147 * fVar94;
          auVar129._4_4_ = fVar149 * fVar97;
          auVar129._8_4_ = fVar150 * fVar99;
          auVar129._12_4_ = fVar151 * fVar124;
          auVar57 = vsubps_avx(auVar129,auVar90);
          auVar117._0_4_ = fVar157 * fVar94;
          auVar117._4_4_ = fVar160 * fVar97;
          auVar117._8_4_ = fVar161 * fVar99;
          auVar117._12_4_ = fVar162 * fVar124;
          auVar36._0_4_ = fVar164 * fVar53;
          auVar36._4_4_ = fVar169 * fVar54;
          auVar36._8_4_ = fVar171 * fVar55;
          auVar36._12_4_ = fVar173 * fVar86;
          auVar58 = vsubps_avx(auVar36,auVar117);
          local_1378._0_4_ =
               fStack_14f0 * auVar44._0_4_ +
               local_1518._4_4_ * auVar57._0_4_ + fVar43 * auVar58._0_4_;
          local_1378._4_4_ =
               fStack_14f0 * auVar44._4_4_ +
               local_1518._4_4_ * auVar57._4_4_ + fVar43 * auVar58._4_4_;
          local_1378._8_4_ =
               fStack_14f0 * auVar44._8_4_ +
               local_1518._4_4_ * auVar57._8_4_ + fVar43 * auVar58._8_4_;
          local_1378._12_4_ =
               fStack_14f0 * auVar44._12_4_ +
               local_1518._4_4_ * auVar57._12_4_ + fVar43 * auVar58._12_4_;
          auVar44 = vsubps_avx(auVar81,auVar70);
          fVar134 = auVar70._0_4_ + auVar81._0_4_;
          fVar135 = auVar70._4_4_ + auVar81._4_4_;
          fVar83 = auVar70._8_4_ + auVar81._8_4_;
          fVar84 = auVar70._12_4_ + auVar81._12_4_;
          auVar81 = vsubps_avx(auVar34,auVar71);
          fVar97 = auVar34._0_4_ + auVar71._0_4_;
          fVar99 = auVar34._4_4_ + auVar71._4_4_;
          fVar124 = auVar34._8_4_ + auVar71._8_4_;
          fVar133 = auVar34._12_4_ + auVar71._12_4_;
          auVar34 = vsubps_avx(auVar101,auVar102);
          fVar54 = auVar101._0_4_ + auVar102._0_4_;
          fVar55 = auVar101._4_4_ + auVar102._4_4_;
          fVar86 = auVar101._8_4_ + auVar102._8_4_;
          fVar94 = auVar101._12_4_ + auVar102._12_4_;
          fVar87 = auVar34._0_4_;
          auVar105._0_4_ = fVar87 * fVar97;
          fVar95 = auVar34._4_4_;
          auVar105._4_4_ = fVar95 * fVar99;
          fVar98 = auVar34._8_4_;
          auVar105._8_4_ = fVar98 * fVar124;
          fVar100 = auVar34._12_4_;
          auVar105._12_4_ = fVar100 * fVar133;
          fVar152 = auVar81._0_4_;
          auVar118._0_4_ = fVar152 * fVar54;
          fVar154 = auVar81._4_4_;
          auVar118._4_4_ = fVar154 * fVar55;
          fVar155 = auVar81._8_4_;
          auVar118._8_4_ = fVar155 * fVar86;
          fVar156 = auVar81._12_4_;
          auVar118._12_4_ = fVar156 * fVar94;
          auVar81 = vsubps_avx(auVar118,auVar105);
          fVar53 = auVar44._0_4_;
          auVar45._0_4_ = fVar53 * fVar54;
          fVar54 = auVar44._4_4_;
          auVar45._4_4_ = fVar54 * fVar55;
          fVar55 = auVar44._8_4_;
          auVar45._8_4_ = fVar55 * fVar86;
          fVar86 = auVar44._12_4_;
          auVar45._12_4_ = fVar86 * fVar94;
          auVar119._0_4_ = fVar87 * fVar134;
          auVar119._4_4_ = fVar95 * fVar135;
          auVar119._8_4_ = fVar98 * fVar83;
          auVar119._12_4_ = fVar100 * fVar84;
          auVar34 = vsubps_avx(auVar119,auVar45);
          auVar74._0_4_ = fVar152 * fVar134;
          auVar74._4_4_ = fVar154 * fVar135;
          auVar74._8_4_ = fVar155 * fVar83;
          auVar74._12_4_ = fVar156 * fVar84;
          auVar59._0_4_ = fVar53 * fVar97;
          auVar59._4_4_ = fVar54 * fVar99;
          auVar59._8_4_ = fVar55 * fVar124;
          auVar59._12_4_ = fVar86 * fVar133;
          auVar101 = vsubps_avx(auVar59,auVar74);
          local_1518._0_4_ = local_1518._4_4_;
          fStack_1510 = local_1518._4_4_;
          fStack_150c = local_1518._4_4_;
          auVar46._0_4_ =
               fStack_14f0 * auVar81._0_4_ +
               local_1518._4_4_ * auVar34._0_4_ + fVar43 * auVar101._0_4_;
          auVar46._4_4_ =
               fStack_14f0 * auVar81._4_4_ +
               local_1518._4_4_ * auVar34._4_4_ + fVar43 * auVar101._4_4_;
          auVar46._8_4_ =
               fStack_14f0 * auVar81._8_4_ +
               local_1518._4_4_ * auVar34._8_4_ + fVar43 * auVar101._8_4_;
          auVar46._12_4_ =
               fStack_14f0 * auVar81._12_4_ +
               local_1518._4_4_ * auVar34._12_4_ + fVar43 * auVar101._12_4_;
          local_1368._0_4_ = auVar46._0_4_ + local_13d8._0_4_ + local_1378._0_4_;
          local_1368._4_4_ = auVar46._4_4_ + local_13d8._4_4_ + local_1378._4_4_;
          local_1368._8_4_ = auVar46._8_4_ + local_13d8._8_4_ + local_1378._8_4_;
          local_1368._12_4_ = auVar46._12_4_ + local_13d8._12_4_ + local_1378._12_4_;
          auVar81 = vminps_avx(local_13d8,local_1378);
          auVar81 = vminps_avx(auVar81,auVar46);
          auVar75._8_4_ = 0x7fffffff;
          auVar75._0_8_ = 0x7fffffff7fffffff;
          auVar75._12_4_ = 0x7fffffff;
          local_13e8 = vandps_avx(local_1368,auVar75);
          auVar76._0_4_ = local_13e8._0_4_ * 1.1920929e-07;
          auVar76._4_4_ = local_13e8._4_4_ * 1.1920929e-07;
          auVar76._8_4_ = local_13e8._8_4_ * 1.1920929e-07;
          auVar76._12_4_ = local_13e8._12_4_ * 1.1920929e-07;
          uVar22 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
          auVar106._0_8_ = uVar22 ^ 0x8000000080000000;
          auVar106._8_4_ = -auVar76._8_4_;
          auVar106._12_4_ = -auVar76._12_4_;
          auVar81 = vcmpps_avx(auVar81,auVar106,5);
          auVar34 = vmaxps_avx(local_13d8,local_1378);
          auVar34 = vmaxps_avx(auVar34,auVar46);
          auVar34 = vcmpps_avx(auVar34,auVar76,2);
          local_13f8 = vorps_avx(auVar81,auVar34);
          local_151d = 0;
          auVar81 = local_1408 & local_13f8;
          if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar81[0xf] < '\0') {
            auVar47._0_4_ = fVar56 * fVar157;
            auVar47._4_4_ = fVar67 * fVar160;
            auVar47._8_4_ = fVar41 * fVar161;
            auVar47._12_4_ = fVar42 * fVar162;
            auVar60._0_4_ = fVar174 * fVar147;
            auVar60._4_4_ = fVar176 * fVar149;
            auVar60._8_4_ = fVar177 * fVar150;
            auVar60._12_4_ = fVar178 * fVar151;
            auVar101 = vsubps_avx(auVar60,auVar47);
            auVar77._0_4_ = fVar147 * fVar152;
            auVar77._4_4_ = fVar149 * fVar154;
            auVar77._8_4_ = fVar150 * fVar155;
            auVar77._12_4_ = fVar151 * fVar156;
            auVar107._0_4_ = fVar157 * fVar87;
            auVar107._4_4_ = fVar160 * fVar95;
            auVar107._8_4_ = fVar161 * fVar98;
            auVar107._12_4_ = fVar162 * fVar100;
            auVar70 = vsubps_avx(auVar107,auVar77);
            auVar120._8_4_ = 0x7fffffff;
            auVar120._0_8_ = 0x7fffffff7fffffff;
            auVar120._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx(auVar47,auVar120);
            auVar34 = vandps_avx(auVar77,auVar120);
            auVar81 = vcmpps_avx(auVar81,auVar34,1);
            local_1308 = vblendvps_avx(auVar70,auVar101,auVar81);
            auVar48._0_4_ = fVar164 * fVar87;
            auVar48._4_4_ = fVar169 * fVar95;
            auVar48._8_4_ = fVar171 * fVar98;
            auVar48._12_4_ = fVar173 * fVar100;
            auVar61._0_4_ = fVar56 * fVar164;
            auVar61._4_4_ = fVar67 * fVar169;
            auVar61._8_4_ = fVar41 * fVar171;
            auVar61._12_4_ = fVar42 * fVar173;
            auVar78._0_4_ = fVar163 * fVar147;
            auVar78._4_4_ = fVar168 * fVar149;
            auVar78._8_4_ = fVar170 * fVar150;
            auVar78._12_4_ = fVar172 * fVar151;
            auVar101 = vsubps_avx(auVar61,auVar78);
            auVar111._0_4_ = fVar147 * fVar53;
            auVar111._4_4_ = fVar149 * fVar54;
            auVar111._8_4_ = fVar150 * fVar55;
            auVar111._12_4_ = fVar151 * fVar86;
            auVar70 = vsubps_avx(auVar111,auVar48);
            auVar81 = vandps_avx(auVar78,auVar120);
            auVar34 = vandps_avx(auVar48,auVar120);
            auVar81 = vcmpps_avx(auVar81,auVar34,1);
            local_12f8 = vblendvps_avx(auVar70,auVar101,auVar81);
            auVar37._0_4_ = fVar157 * fVar53;
            auVar37._4_4_ = fVar160 * fVar54;
            auVar37._8_4_ = fVar161 * fVar55;
            auVar37._12_4_ = fVar162 * fVar86;
            auVar62._0_4_ = fVar163 * fVar157;
            auVar62._4_4_ = fVar168 * fVar160;
            auVar62._8_4_ = fVar170 * fVar161;
            auVar62._12_4_ = fVar172 * fVar162;
            auVar79._0_4_ = fVar174 * fVar164;
            auVar79._4_4_ = fVar176 * fVar169;
            auVar79._8_4_ = fVar177 * fVar171;
            auVar79._12_4_ = fVar178 * fVar173;
            auVar112._0_4_ = fVar164 * fVar152;
            auVar112._4_4_ = fVar169 * fVar154;
            auVar112._8_4_ = fVar171 * fVar155;
            auVar112._12_4_ = fVar173 * fVar156;
            auVar101 = vsubps_avx(auVar62,auVar79);
            auVar70 = vsubps_avx(auVar112,auVar37);
            auVar81 = vandps_avx(auVar79,auVar120);
            auVar34 = vandps_avx(auVar37,auVar120);
            auVar81 = vcmpps_avx(auVar81,auVar34,1);
            local_12e8 = vblendvps_avx(auVar70,auVar101,auVar81);
            fVar56 = local_1308._0_4_ * fStack_14f0 +
                     local_12f8._0_4_ * local_1518._4_4_ + local_12e8._0_4_ * fVar43;
            fVar53 = local_1308._4_4_ * fStack_14f0 +
                     local_12f8._4_4_ * local_1518._4_4_ + local_12e8._4_4_ * fVar43;
            fVar67 = local_1308._8_4_ * fStack_14f0 +
                     local_12f8._8_4_ * local_1518._4_4_ + local_12e8._8_4_ * fVar43;
            fVar43 = local_1308._12_4_ * fStack_14f0 +
                     local_12f8._12_4_ * local_1518._4_4_ + local_12e8._12_4_ * fVar43;
            auVar80._0_4_ = fVar56 + fVar56;
            auVar80._4_4_ = fVar53 + fVar53;
            auVar80._8_4_ = fVar67 + fVar67;
            auVar80._12_4_ = fVar43 + fVar43;
            fVar56 = local_1308._0_4_ * fVar93 +
                     local_12f8._0_4_ * fVar85 + local_12e8._0_4_ * fVar142;
            fVar66 = local_1308._4_4_ * fVar66 +
                     local_12f8._4_4_ * fVar96 + local_12e8._4_4_ * fVar144;
            fVar68 = local_1308._8_4_ * fVar69 +
                     local_12f8._8_4_ * fVar68 + local_12e8._8_4_ * fVar145;
            fVar69 = local_1308._12_4_ * fVar13 +
                     local_12f8._12_4_ * fVar12 + local_12e8._12_4_ * fVar146;
            auVar81 = vrcpps_avx(auVar80);
            fVar43 = auVar81._0_4_;
            auVar121._0_4_ = auVar80._0_4_ * fVar43;
            fVar85 = auVar81._4_4_;
            auVar121._4_4_ = auVar80._4_4_ * fVar85;
            fVar93 = auVar81._8_4_;
            auVar121._8_4_ = auVar80._8_4_ * fVar93;
            fVar96 = auVar81._12_4_;
            auVar121._12_4_ = auVar80._12_4_ * fVar96;
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            auVar81 = vsubps_avx(auVar130,auVar121);
            local_1318._0_4_ = (fVar56 + fVar56) * (fVar43 + fVar43 * auVar81._0_4_);
            local_1318._4_4_ = (fVar66 + fVar66) * (fVar85 + fVar85 * auVar81._4_4_);
            local_1318._8_4_ = (fVar68 + fVar68) * (fVar93 + fVar93 * auVar81._8_4_);
            local_1318._12_4_ = (fVar69 + fVar69) * (fVar96 + fVar96 * auVar81._12_4_);
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar113._4_4_ = uVar4;
            auVar113._0_4_ = uVar4;
            auVar113._8_4_ = uVar4;
            auVar113._12_4_ = uVar4;
            auVar81 = vcmpps_avx(auVar113,local_1318,2);
            fVar43 = ray->tfar;
            auVar122._4_4_ = fVar43;
            auVar122._0_4_ = fVar43;
            auVar122._8_4_ = fVar43;
            auVar122._12_4_ = fVar43;
            auVar34 = vcmpps_avx(local_1318,auVar122,2);
            auVar81 = vandps_avx(auVar81,auVar34);
            auVar34 = vcmpps_avx(auVar80,_DAT_01f45a50,4);
            auVar81 = vandps_avx(auVar34,auVar81);
            auVar34 = vpand_avx(local_13f8,local_1408);
            auVar81 = vpslld_avx(auVar81,0x1f);
            auVar81 = vpsrad_avx(auVar81,0x1f);
            local_1348 = vpand_avx(auVar81,auVar34);
            uVar24 = vmovmskps_avx(local_1348);
            if (uVar24 != 0) {
              local_1388 = local_13d8;
              local_1358 = &local_151d;
              auVar81 = vrcpps_avx(local_1368);
              fVar43 = auVar81._0_4_;
              auVar49._0_4_ = local_1368._0_4_ * fVar43;
              fVar85 = auVar81._4_4_;
              auVar49._4_4_ = local_1368._4_4_ * fVar85;
              fVar93 = auVar81._8_4_;
              auVar49._8_4_ = local_1368._8_4_ * fVar93;
              fVar96 = auVar81._12_4_;
              auVar49._12_4_ = local_1368._12_4_ * fVar96;
              auVar63._8_4_ = 0x3f800000;
              auVar63._0_8_ = 0x3f8000003f800000;
              auVar63._12_4_ = 0x3f800000;
              auVar81 = vsubps_avx(auVar63,auVar49);
              auVar38._0_4_ = fVar43 + fVar43 * auVar81._0_4_;
              auVar38._4_4_ = fVar85 + fVar85 * auVar81._4_4_;
              auVar38._8_4_ = fVar93 + fVar93 * auVar81._8_4_;
              auVar38._12_4_ = fVar96 + fVar96 * auVar81._12_4_;
              auVar50._8_4_ = 0x219392ef;
              auVar50._0_8_ = 0x219392ef219392ef;
              auVar50._12_4_ = 0x219392ef;
              auVar81 = vcmpps_avx(local_13e8,auVar50,5);
              auVar81 = vandps_avx(auVar81,auVar38);
              auVar51._0_4_ = local_13d8._0_4_ * auVar81._0_4_;
              auVar51._4_4_ = local_13d8._4_4_ * auVar81._4_4_;
              auVar51._8_4_ = local_13d8._8_4_ * auVar81._8_4_;
              auVar51._12_4_ = local_13d8._12_4_ * auVar81._12_4_;
              local_1338 = vminps_avx(auVar51,auVar63);
              auVar39._0_4_ = local_1378._0_4_ * auVar81._0_4_;
              auVar39._4_4_ = local_1378._4_4_ * auVar81._4_4_;
              auVar39._8_4_ = local_1378._8_4_ * auVar81._8_4_;
              auVar39._12_4_ = local_1378._12_4_ * auVar81._12_4_;
              local_1328 = vminps_avx(auVar39,auVar63);
              uVar22 = (ulong)(uVar24 & 0xff);
              local_1480 = puVar29;
              do {
                uVar26 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                local_1450 = *(uint *)((long)&local_1398 + uVar26 * 4);
                pGVar11 = (pSVar27->geometries).items[local_1450].ptr;
                if ((pGVar11->mask & ray->mask) == 0) {
                  uVar22 = uVar22 ^ 1L << (uVar26 & 0x3f);
                }
                else {
                  local_14f8 = local_14e0->args;
                  if ((local_14e0->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e73d05;
                  local_14a8._0_8_ = uVar22;
                  local_1498._0_8_ = pSVar27;
                  local_1508._0_8_ = uVar30;
                  local_1438.context = local_14e0->user;
                  local_1468 = *(undefined4 *)(local_1308 + uVar26 * 4);
                  local_1464 = *(undefined4 *)(local_12f8 + uVar26 * 4);
                  local_1460 = *(undefined4 *)(local_12e8 + uVar26 * 4);
                  local_145c = *(undefined4 *)(local_1338 + uVar26 * 4);
                  local_1458 = *(undefined4 *)(local_1328 + uVar26 * 4);
                  local_1454 = *(undefined4 *)((long)&local_13a8 + uVar26 * 4);
                  local_144c = (local_1438.context)->instID[0];
                  local_1448 = (local_1438.context)->instPrimID[0];
                  local_14c8._0_4_ = ray->tfar;
                  local_14b8._0_8_ = uVar26;
                  ray->tfar = *(float *)(local_1318 + uVar26 * 4);
                  local_151c = -1;
                  local_1438.valid = &local_151c;
                  local_1438.geometryUserPtr = pGVar11->userPtr;
                  local_1518 = ray;
                  local_1438.hit = (RTCHitN *)&local_1468;
                  local_1438.N = 1;
                  local_14d8._0_8_ = pGVar11;
                  local_1438.ray = (RTCRayN *)ray;
                  if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar11->occlusionFilterN)(&local_1438), *local_1438.valid != 0)) {
                    ray = local_1518;
                    if ((local_14f8->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_14f8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        ((*(byte *)(local_14d8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e73d05:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (*local_14f8->filter)(&local_1438);
                    ray = local_1518;
                    if (*local_1438.valid != 0) goto LAB_00e73d05;
                  }
                  local_1518->tfar = (float)local_14c8._0_4_;
                  uVar22 = local_14a8._0_8_ ^ 1L << (local_14b8._0_8_ & 0x3f);
                  pSVar27 = (Scene *)local_1498._0_8_;
                  ray = local_1518;
                  puVar29 = local_1480;
                  uVar30 = local_1508._0_8_;
                }
              } while (uVar22 != 0);
            }
          }
          auVar148 = ZEXT3264(local_1258);
          auVar153 = ZEXT3264(local_1278);
          auVar159 = ZEXT3264(local_1298);
          auVar167 = ZEXT3264(local_12b8);
          auVar175 = ZEXT3264(local_12d8);
          context = local_14e0;
        }
        goto LAB_00e7328e;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }